

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Page.cc
# Opt level: O2

void __thiscall MyDB_PageBase::reduceCount(MyDB_PageBase *this)

{
  int *piVar1;
  MyDB_BufferManager *pMVar2;
  unsigned_long local_10;
  
  piVar1 = &this->handleCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    local_10 = (unsigned_long)this->slotId;
    this->isPined = false;
    if (local_10 != 0xffffffffffffffff) {
      pMVar2 = this->bufferManager;
      if (this->addr != (void *)0x0) {
        std::deque<void_*,_std::allocator<void_*>_>::push_back
                  (&(pMVar2->availPageQueue).c,&this->addr);
        pMVar2 = this->bufferManager;
        local_10 = (unsigned_long)this->slotId;
      }
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&(pMVar2->slotQueue).c,&local_10);
    }
    return;
  }
  return;
}

Assistant:

void MyDB_PageBase:: reduceCount() {

    this -> handleCount--;
    // if count turn to 0, decided if recycle
    if (handleCount == 0) {
        // if this page is a normal page
        if (slotId == -1) {
            // set the normal page unpined no matter if it is in the buffer
            this -> isPined = false;
        }
        // this page is anonymous
        else {
            this -> isPined = false;
            // if this page is in the buffer
            if (this -> addr != nullptr) {
                this -> bufferManager -> availPageQueue.push(this -> addr);
                this -> bufferManager -> slotQueue.push(this -> slotId);
            }
            // if this page is not in the buffer
            else {
                this -> bufferManager -> slotQueue.push(this -> slotId);
            }
            //delete this;
        }
    }
}